

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state)

{
  uint8_t uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if ((state->exponent_type != POSITIVE) &&
     (uVar1 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar1 != '\0')) {
    state->excessive_decimals = uVar1;
  }
  if ((state->excessive_decimals != '\0') &&
     (bVar2 = TruncateExcessiveDecimals<duckdb::DecimalCastData<short>,false>(state), !bVar2)) {
    return false;
  }
  if (((state->exponent_type == NONE) && (state->round_set == true)) &&
     (state->should_round == true)) {
    state->result = state->result + 1;
  }
  if (state->decimal_count < state->scale) {
    bVar3 = state->scale + ~state->decimal_count;
    auVar12._8_8_ = 0x1000100010001;
    auVar12._0_8_ = (ulong)(ushort)state->result | 0x1000100010000;
    auVar8._1_3_ = 0;
    auVar8[0] = bVar3;
    auVar8[4] = bVar3;
    auVar8._5_3_ = 0;
    auVar8[8] = bVar3;
    auVar8._9_3_ = 0;
    auVar8[0xc] = bVar3;
    auVar8._13_3_ = 0;
    iVar4 = 8;
    do {
      auVar7 = auVar12;
      auVar12._0_2_ = auVar7._0_2_ * L'\n';
      auVar12._2_2_ = auVar7._2_2_ * L'\n';
      auVar12._4_2_ = auVar7._4_2_ * L'\n';
      auVar12._6_2_ = auVar7._6_2_ * L'\n';
      auVar12._8_2_ = auVar7._8_2_ * L'\n';
      auVar12._10_2_ = auVar7._10_2_ * L'\n';
      auVar12._12_2_ = auVar7._12_2_ * L'\n';
      auVar12._14_2_ = auVar7._14_2_ * L'\n';
      iVar5 = iVar4 + -8;
      iVar6 = iVar4 + (bVar3 + 8 & 0xfffffff8);
      iVar4 = iVar5;
    } while (iVar6 != 0x10);
    iVar5 = -iVar5;
    auVar11._4_4_ = iVar5;
    auVar11._0_4_ = iVar5;
    auVar11._8_4_ = iVar5;
    auVar11._12_4_ = iVar5;
    auVar8 = auVar8 | _DAT_01dd7b40;
    auVar9 = (auVar11 | _DAT_01e126c0) ^ _DAT_01dd7b40;
    auVar10._0_4_ = -(uint)(auVar8._0_4_ < auVar9._0_4_);
    auVar10._4_4_ = -(uint)(auVar8._4_4_ < auVar9._4_4_);
    auVar10._8_4_ = -(uint)(auVar8._8_4_ < auVar9._8_4_);
    auVar10._12_4_ = -(uint)(auVar8._12_4_ < auVar9._12_4_);
    auVar11 = (ram0x01e126b0 | auVar11) ^ _DAT_01dd7b40;
    auVar9._0_4_ = -(uint)(auVar8._0_4_ < auVar11._0_4_);
    auVar9._4_4_ = -(uint)(auVar8._4_4_ < auVar11._4_4_);
    auVar9._8_4_ = -(uint)(auVar8._8_4_ < auVar11._8_4_);
    auVar9._12_4_ = -(uint)(auVar8._12_4_ < auVar11._12_4_);
    auVar8 = packssdw(auVar9,auVar10);
    auVar12 = ~auVar8 & auVar12 | auVar7 & auVar8;
    state->result =
         auVar12._14_2_ * auVar12._6_2_ * auVar12._10_2_ * auVar12._2_2_ *
         auVar12._12_2_ * auVar12._4_2_ * auVar12._8_2_ * auVar12._0_2_;
  }
  return state->result < state->limit;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}